

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall
CUI::Init(CUI *this,CConfig *pConfig,IGraphics *pGraphics,IInput *pInput,ITextRender *pTextRender)

{
  IInput *in_RCX;
  IGraphics *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  ITextRender *in_R8;
  
  *(undefined8 *)(in_RDI + 0x400) = in_RSI;
  *(IGraphics **)(in_RDI + 0x408) = in_RDX;
  *(IInput **)(in_RDI + 0x410) = in_RCX;
  *(ITextRender **)(in_RDI + 0x418) = in_R8;
  CUIRect::Init(in_RDX);
  CLineInput::Init(in_RCX,in_R8,in_RDX);
  return;
}

Assistant:

void CUI::Init(class CConfig *pConfig, class IGraphics *pGraphics, class IInput *pInput, class ITextRender *pTextRender)
{
	m_pConfig = pConfig;
	m_pGraphics = pGraphics;
	m_pInput = pInput;
	m_pTextRender = pTextRender;
	CUIRect::Init(pGraphics);
	CLineInput::Init(pInput, pTextRender, pGraphics);
}